

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QTextCursorPrivate>::detach_helper(QSharedDataPointer<QTextCursorPrivate> *this)

{
  int *piVar1;
  QTextCursorPrivate *this_00;
  QTextCursorPrivate *this_01;
  
  this_01 = (QTextCursorPrivate *)operator_new(0x30);
  QTextCursorPrivate::QTextCursorPrivate(this_01,*(QTextCursorPrivate **)this);
  LOCK();
  *(int *)this_01 = *(int *)this_01 + 1;
  UNLOCK();
  piVar1 = *(int **)this;
  LOCK();
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if ((*piVar1 == 0) &&
     (this_00 = *(QTextCursorPrivate **)this, this_00 != (QTextCursorPrivate *)0x0)) {
    QTextCursorPrivate::~QTextCursorPrivate(this_00);
    operator_delete(this_00,0x30);
  }
  *(QTextCursorPrivate **)this = this_01;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}